

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O0

void __thiscall
MonahanPlanner::CheckMaxNrVectors(MonahanPlanner *this,size_t maxNrAlphas,size_t nrAlphas)

{
  ostream *poVar1;
  E *this_00;
  string *arg;
  ulong in_RDX;
  ulong in_RSI;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  ulong local_18;
  ulong local_10;
  
  if ((in_RSI != 0) && (in_RSI < in_RDX)) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,"MonahanPlanner::CheckMaxNrVectors too many alpha vectors ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    this_00 = (E *)std::operator<<(poVar1,">");
    std::ostream::operator<<(this_00,local_10);
    arg = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    E::E(this_00,arg);
    __cxa_throw(arg,&E::typeinfo,E::~E);
  }
  return;
}

Assistant:

void MonahanPlanner::CheckMaxNrVectors(size_t maxNrAlphas, size_t nrAlphas) const
{
    if(maxNrAlphas && nrAlphas>maxNrAlphas)
    {
        stringstream ss;
        ss << "MonahanPlanner::CheckMaxNrVectors too many alpha vectors "
           << nrAlphas << ">" << maxNrAlphas;
        throw(E(ss.str()));
    }
}